

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_label_name_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::CheckLabelNameTest_reject_le_for_histogram_Test::TestBody
          (CheckLabelNameTest_reject_le_for_histogram_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  allocator local_49;
  string local_48;
  bool local_22;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  CheckLabelNameTest_reject_le_for_histogram_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  pPVar2 = testing::WithParamInterface<prometheus::MetricType>::GetParam();
  local_21 = *pPVar2 != Histogram;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"le",&local_49);
  local_22 = CheckLabelNameTest::CheckLabelName(&this->super_CheckLabelNameTest,&local_48);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_20,"GetParam() != MetricType::Histogram","CheckLabelName(\"le\")",
             &local_21,&local_22);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/check_label_name_test.cc"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST_P(CheckLabelNameTest, reject_le_for_histogram) {
  EXPECT_EQ(GetParam() != MetricType::Histogram, CheckLabelName("le"));
}